

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
spdlog::details::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string *in_RSI;
  __uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
  in_RDI;
  pointer __p;
  allocator *this;
  undefined1 local_a8 [40];
  _Alloc_hider custom_user_flags;
  string *eol;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  pattern_formatter *in_stack_ffffffffffffffa0;
  string *local_10;
  
  local_10 = in_RSI;
  operator_new(0xe0);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,local_10);
  this = (allocator *)&stack0xffffffffffffff9f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,"\n",this);
  local_a8._32_8_ = 0;
  custom_user_flags._M_p = (pointer)0x0;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  local_a8._0_8_ = (_func_int **)0x0;
  local_a8._8_8_ = (pointer)0x0;
  eol = (string *)0x0;
  __p = (pointer)local_a8;
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                   *)0x219e4f);
  pattern_formatter::pattern_formatter
            (in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94
             ,eol,(custom_flags *)custom_user_flags._M_p);
  std::unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>>::
  unique_ptr<std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)this,__p);
  std::
  unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
  ::~unordered_map((unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
                    *)0x219e8c);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(tuple<spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>)
           in_RDI.
           super___uniq_ptr_impl<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
           ._M_t.
           super__Tuple_impl<0UL,_spdlog::pattern_formatter_*,_std::default_delete<spdlog::pattern_formatter>_>
           .super__Head_base<0UL,_spdlog::pattern_formatter_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args)
{
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}